

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFromFraig(Fraig_Man_t *pMan,Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar1;
  Fraig_Node_t *pFVar2;
  Fraig_Node_t *pData;
  ProgressBar *p;
  Fraig_Node_t **ppFVar3;
  Abc_Obj_t *pFanin;
  char *pString;
  int i;
  long lVar4;
  
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  for (i = 0; i < pNtk->vCis->nSize; i = i + 1) {
    pAVar1 = Abc_NtkCi(pNtk,i);
    pFVar2 = Fraig_ManReadIthVar(pMan,i);
    Fraig_NodeSetData1(pFVar2,(Fraig_Node_t *)(pAVar1->field_6).pCopy);
  }
  pFVar2 = Fraig_ManReadConst1(pMan);
  pData = (Fraig_Node_t *)Abc_AigConst1(pNtk_00);
  Fraig_NodeSetData1(pFVar2,pData);
  p = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
  for (lVar4 = 0; lVar4 < pNtk->vCos->nSize; lVar4 = lVar4 + 1) {
    pAVar1 = Abc_NtkCo(pNtk,(int)lVar4);
    Extra_ProgressBarUpdate(p,(int)lVar4,pString);
    ppFVar3 = Fraig_ManReadOutputs(pMan);
    pFanin = Abc_NodeFromFraig_rec(pNtk_00,ppFVar3[lVar4]);
    Abc_ObjAddFanin((pAVar1->field_6).pCopy,pFanin);
  }
  Extra_ProgressBarStop(p);
  Abc_NtkReassignIds(pNtk_00);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromFraig( Fraig_Man_t * pMan, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode, * pNodeNew;
    int i;
    // create the new network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // make the mapper point to the new network
    Abc_NtkForEachCi( pNtk, pNode, i )
        Fraig_NodeSetData1( Fraig_ManReadIthVar(pMan, i), (Fraig_Node_t *)pNode->pCopy );
    // set the constant node
    Fraig_NodeSetData1( Fraig_ManReadConst1(pMan), (Fraig_Node_t *)Abc_AigConst1(pNtkNew) );
    // process the nodes in topological order
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        pNodeNew = Abc_NodeFromFraig_rec( pNtkNew, Fraig_ManReadOutputs(pMan)[i] );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
    }
    Extra_ProgressBarStop( pProgress );
    Abc_NtkReassignIds( pNtkNew );
    return pNtkNew;
}